

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.c
# Opt level: O0

int cmd_print(char *arg)

{
  FILE *pFVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  int *piVar5;
  void *rlcd;
  FILE *output;
  long lStack_60;
  LYS_OUTFORMAT format;
  lys_module *module;
  char *out_path;
  char *revision;
  char *model_name;
  char *target_path;
  char *ptr;
  char **argv;
  int tree_opts;
  int tree_ll;
  int ret;
  int option_index;
  int argc;
  int c;
  char *arg_local;
  
  tree_opts = 1;
  argv._4_4_ = 0;
  argv._0_4_ = 0;
  model_name = (char *)0x0;
  module = (lys_module *)0x0;
  output._4_4_ = 3;
  rlcd = _stdout;
  ret = 1;
  _argc = arg;
  ptr = (char *)malloc(0x10);
  pcVar3 = strdup(_argc);
  *(char **)ptr = pcVar3;
  strtok(*(char **)ptr," ");
  while (pcVar3 = strtok((char *)0x0," "), pcVar3 != (char *)0x0) {
    pcVar4 = (char *)realloc(ptr,(long)(ret + 2) << 3);
    pFVar1 = _stderr;
    if (pcVar4 == (char *)0x0) {
      piVar5 = __errno_location();
      pcVar3 = strerror(*piVar5);
      fprintf(pFVar1,"Memory allocation failed (%s:%d, %s)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/tools/lint/commands.c"
              ,0x178,pcVar3);
      goto LAB_001085e6;
    }
    *(char **)(pcVar4 + (long)ret * 8) = pcVar3;
    ptr = pcVar4;
    ret = ret + 1;
  }
  pcVar3 = ptr + (long)ret * 8;
  pcVar3[0] = '\0';
  pcVar3[1] = '\0';
  pcVar3[2] = '\0';
  pcVar3[3] = '\0';
  pcVar3[4] = '\0';
  pcVar3[5] = '\0';
  pcVar3[6] = '\0';
  pcVar3[7] = '\0';
  _optind = 0;
  do {
    tree_ll = 0;
    option_index = getopt_long(ret,ptr,"hf:go:guP:L:",cmd_print::long_options,&tree_ll);
    if (option_index == -1) {
      if (_optind == ret) {
        fprintf(_stderr,"Missing the module name.\n");
      }
      else {
        if ((((uint)argv != 0) || (argv._4_4_ != 0)) && (output._4_4_ != 3)) {
          fprintf(_stderr,"--tree options take effect only in case of the tree output format.\n");
        }
        pcVar3 = *(char **)(ptr + (long)_optind * 8);
        out_path = (char *)0x0;
        pcVar4 = strchr(pcVar3,0x40);
        if (pcVar4 != (char *)0x0) {
          pcVar4 = strchr(pcVar3,0x40);
          *pcVar4 = '\0';
          out_path = pcVar4 + 1;
        }
        lStack_60 = ly_ctx_get_module(ctx,pcVar3,out_path,0);
        if (lStack_60 == 0) {
          lStack_60 = ly_ctx_get_submodule(ctx,0,0,pcVar3,out_path);
        }
        if (lStack_60 == 0) {
          if (out_path == (char *)0x0) {
            fprintf(_stderr,"No (sub)module \"%s\" found.\n",pcVar3);
          }
          else {
            fprintf(_stderr,"No (sub)module \"%s\" in revision %s found.\n",pcVar3,out_path);
          }
        }
        else if ((module == (lys_module *)0x0) ||
                (rlcd = fopen((char *)module,"w"), pFVar1 = _stderr, (FILE *)rlcd != (FILE *)0x0)) {
          tree_opts = lys_print_file(rlcd,lStack_60,output._4_4_,model_name,argv._4_4_,(uint)argv);
          if (output._4_4_ == 5) {
            fputs("\n",(FILE *)rlcd);
          }
        }
        else {
          piVar5 = __errno_location();
          pcVar3 = strerror(*piVar5);
          fprintf(pFVar1,"Could not open the output file (%s).\n",pcVar3);
        }
      }
LAB_001085e6:
      free(*(void **)ptr);
      free(ptr);
      if ((rlcd != (void *)0x0) && (rlcd != _stdout)) {
        fclose((FILE *)rlcd);
      }
      return tree_opts;
    }
    switch(option_index) {
    case 0x3f:
      fprintf(_stderr,"Unknown option \"%d\".\n",(ulong)(uint)(int)(char)option_index);
      goto LAB_001085e6;
    case 0x4c:
      argv._4_4_ = atoi((char *)_optarg);
      break;
    case 0x50:
      model_name = (char *)_optarg;
      break;
    case 0x66:
      iVar2 = strcmp((char *)_optarg,"yang");
      if (iVar2 == 0) {
        output._4_4_ = 1;
      }
      else {
        iVar2 = strcmp((char *)_optarg,"yin");
        if (iVar2 == 0) {
          output._4_4_ = 2;
        }
        else {
          iVar2 = strcmp((char *)_optarg,"tree");
          if (iVar2 == 0) {
            output._4_4_ = 3;
          }
          else {
            iVar2 = strcmp((char *)_optarg,"tree-rfc");
            if (iVar2 == 0) {
              output._4_4_ = 3;
              argv._0_4_ = (uint)argv | 1;
            }
            else {
              iVar2 = strcmp((char *)_optarg,"info");
              if (iVar2 == 0) {
                output._4_4_ = 4;
              }
              else {
                iVar2 = strcmp((char *)_optarg,"jsons");
                if (iVar2 != 0) {
                  fprintf(_stderr,"Unknown output format \"%s\".\n",_optarg);
                  goto LAB_001085e6;
                }
                output._4_4_ = 5;
              }
            }
          }
        }
      }
      break;
    case 0x67:
      argv._0_4_ = (uint)argv | 2;
      break;
    case 0x68:
      cmd_print_help();
      tree_opts = 0;
      goto LAB_001085e6;
    case 0x6e:
      argv._0_4_ = (uint)argv | 8;
      break;
    case 0x6f:
      if (module != (lys_module *)0x0) {
        fprintf(_stderr,"Output specified twice.\n");
        goto LAB_001085e6;
      }
      module = _optarg;
      break;
    case 0x75:
      argv._0_4_ = (uint)argv | 4;
    }
  } while( true );
}

Assistant:

int
cmd_print(const char *arg)
{
    int c, argc, option_index, ret = 1, tree_ll = 0, tree_opts = 0;
    char **argv = NULL, *ptr, *target_path = NULL, *model_name, *revision;
    const char *out_path = NULL;
    const struct lys_module *module;
    LYS_OUTFORMAT format = LYS_OUT_TREE;
    FILE *output = stdout;
    static struct option long_options[] = {
        {"help", no_argument, 0, 'h'},
        {"format", required_argument, 0, 'f'},
        {"output", required_argument, 0, 'o'},
        {"tree-print-groupings", no_argument, 0, 'g'},
        {"tree-print-uses", no_argument, 0, 'u'},
        {"tree-no-leafref-target", no_argument, 0, 'n'},
        {"tree-path", required_argument, 0, 'P'},
        {"info-path", required_argument, 0, 'P'},
        {"tree-line-length", required_argument, 0, 'L'},
        {NULL, 0, 0, 0}
    };
    void *rlcd;

    argc = 1;
    argv = malloc(2*sizeof *argv);
    *argv = strdup(arg);
    ptr = strtok(*argv, " ");
    while ((ptr = strtok(NULL, " "))) {
        rlcd = realloc(argv, (argc+2)*sizeof *argv);
        if (!rlcd) {
            fprintf(stderr, "Memory allocation failed (%s:%d, %s)", __FILE__, __LINE__, strerror(errno));
            goto cleanup;
        }
        argv = rlcd;
        argv[argc++] = ptr;
    }
    argv[argc] = NULL;

    optind = 0;
    while (1) {
        option_index = 0;
        c = getopt_long(argc, argv, "hf:go:guP:L:", long_options, &option_index);
        if (c == -1) {
            break;
        }

        switch (c) {
        case 'h':
            cmd_print_help();
            ret = 0;
            goto cleanup;
        case 'f':
            if (!strcmp(optarg, "yang")) {
                format = LYS_OUT_YANG;
            } else if (!strcmp(optarg, "yin")) {
                format = LYS_OUT_YIN;
            } else if (!strcmp(optarg, "tree")) {
                format = LYS_OUT_TREE;
            } else if (!strcmp(optarg, "tree-rfc")) {
                format = LYS_OUT_TREE;
                tree_opts |= LYS_OUTOPT_TREE_RFC;
            } else if (!strcmp(optarg, "info")) {
                format = LYS_OUT_INFO;
            } else if (!strcmp(optarg, "jsons")) {
                format = LYS_OUT_JSON;
            } else {
                fprintf(stderr, "Unknown output format \"%s\".\n", optarg);
                goto cleanup;
            }
            break;
        case 'o':
            if (out_path) {
                fprintf(stderr, "Output specified twice.\n");
                goto cleanup;
            }
            out_path = optarg;
            break;
        case 'g':
            tree_opts |= LYS_OUTOPT_TREE_GROUPING;
            break;
        case 'u':
            tree_opts |= LYS_OUTOPT_TREE_USES;
            break;
        case 'n':
            tree_opts |= LYS_OUTOPT_TREE_NO_LEAFREF;
            break;
        case 'P':
            target_path = optarg;
            break;
        case 'L':
            tree_ll = atoi(optarg);
            break;
        case '?':
            fprintf(stderr, "Unknown option \"%d\".\n", (char)c);
            goto cleanup;
        }
    }

    /* file name */
    if (optind == argc) {
        fprintf(stderr, "Missing the module name.\n");
        goto cleanup;
    }

    /* tree fromat with or without gropings */
    if ((tree_opts || tree_ll) && format != LYS_OUT_TREE) {
        fprintf(stderr, "--tree options take effect only in case of the tree output format.\n");
    }

    /* module, revision */
    model_name = argv[optind];
    revision = NULL;
    if (strchr(model_name, '@')) {
        revision = strchr(model_name, '@');
        revision[0] = '\0';
        ++revision;
    }

    module = ly_ctx_get_module(ctx, model_name, revision, 0);
    if (!module) {
        /* not a module, try to find it as a submodule */
        module = (const struct lys_module *)ly_ctx_get_submodule(ctx, NULL, NULL, model_name, revision);
    }

    if (!module) {
        if (revision) {
            fprintf(stderr, "No (sub)module \"%s\" in revision %s found.\n", model_name, revision);
        } else {
            fprintf(stderr, "No (sub)module \"%s\" found.\n", model_name);
        }
        goto cleanup;
    }

    if (out_path) {
        output = fopen(out_path, "w");
        if (!output) {
            fprintf(stderr, "Could not open the output file (%s).\n", strerror(errno));
            goto cleanup;
        }
    }

    ret = lys_print_file(output, module, format, target_path, tree_ll, tree_opts);
    if (format == LYS_OUT_JSON) {
        fputs("\n", output);
    }

cleanup:
    free(*argv);
    free(argv);

    if (output && (output != stdout)) {
        fclose(output);
    }

    return ret;
}